

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UChar32 ucnv_MBCSSingleGetNextUChar(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  uint uVar1;
  UConverter *pUVar2;
  uint8_t *puVar3;
  byte bVar4;
  UBool UVar5;
  uint8_t action;
  int32_t entry;
  uint8_t *sourceLimit;
  uint8_t *source;
  int32_t (*stateTable) [256];
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pArgs_local;
  
  pUVar2 = pArgs->converter;
  puVar3 = (uint8_t *)pArgs->source;
  if ((pUVar2->options & 0x10) == 0) {
    source = (uint8_t *)(pUVar2->sharedData->mbcs).stateTable;
  }
  else {
    source = (uint8_t *)(pUVar2->sharedData->mbcs).swapLFNLStateTable;
  }
  do {
    sourceLimit = puVar3;
    if (pArgs->sourceLimit <= sourceLimit) goto LAB_00197cfd;
    uVar1 = *(uint *)(source + (ulong)*sourceLimit * 4);
    pArgs->source = (char *)(sourceLimit + 1);
    if ((int)uVar1 < -0x7ff00000) {
      return uVar1 & 0xffff;
    }
    bVar4 = (byte)(uVar1 >> 0x14) & 0xf;
    if ((bVar4 == 1) || (bVar4 == 3)) {
      return (uVar1 & 0xfffff) + 0x10000;
    }
    if (bVar4 == 2) {
      return uVar1 & 0xffff;
    }
    if (bVar4 == 6) goto LAB_00197cd3;
    puVar3 = sourceLimit + 1;
  } while (bVar4 != 7);
  *pErrorCode = U_ILLEGAL_CHAR_FOUND;
LAB_00197cd3:
  UVar5 = U_FAILURE(*pErrorCode);
  if (UVar5 == '\0') {
    pArgs->source = (char *)sourceLimit;
    pArgs_local._4_4_ = -9;
  }
  else {
LAB_00197cfd:
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    pArgs_local._4_4_ = 0xffff;
  }
  return pArgs_local._4_4_;
}

Assistant:

static UChar32
ucnv_MBCSSingleGetNextUChar(UConverterToUnicodeArgs *pArgs,
                        UErrorCode *pErrorCode) {
    UConverter *cnv;
    const int32_t (*stateTable)[256];
    const uint8_t *source, *sourceLimit;

    int32_t entry;
    uint8_t action;

    /* set up the local pointers */
    cnv=pArgs->converter;
    source=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }

    /* conversion loop */
    while(source<sourceLimit) {
        entry=stateTable[0][*source++];
        /* MBCS_ENTRY_IS_FINAL(entry) */

        /* write back the updated pointer early so that we can return directly */
        pArgs->source=(const char *)source;

        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
            /* output BMP code point */
            return (UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
        }

        /*
         * An if-else-if chain provides more reliable performance for
         * the most common cases compared to a switch.
         */
        action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if( action==MBCS_STATE_VALID_DIRECT_20 ||
            (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
        ) {
            /* output supplementary code point */
            return (UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
        } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
            if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                /* output BMP code point */
                return (UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            }
        } else if(action==MBCS_STATE_UNASSIGNED) {
            /* just fall through */
        } else if(action==MBCS_STATE_ILLEGAL) {
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
        } else {
            /* reserved, must never occur */
            continue;
        }

        if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            break;
        } else /* unassigned sequence */ {
            /* defer to the generic implementation */
            pArgs->source=(const char *)source-1;
            return UCNV_GET_NEXT_UCHAR_USE_TO_U;
        }
    }

    /* no output because of empty input or only state changes */
    *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    return 0xffff;
}